

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
  *this_00;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar11;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar12;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar13;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar14;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar15;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar16;
  long lVar17;
  value_type vVar18;
  
  this_00 = &this->right_->fadexpr_;
  pFVar11 = (this->left_->fadexpr_).left_;
  pFVar12 = (pFVar11->fadexpr_).left_;
  lVar17 = (long)i;
  dVar1 = *(double *)(*(long *)((long)(pFVar12->fadexpr_).left_ + 0x10) + lVar17 * 8);
  dVar2 = (((pFVar12->fadexpr_).right_)->dx_).ptr_to_data[lVar17];
  dVar3 = (((pFVar11->fadexpr_).right_)->dx_).ptr_to_data[lVar17];
  pFVar13 = (this_00->left_->fadexpr_).left_;
  pFVar14 = (this_00->left_->fadexpr_).right_;
  pFVar15 = (pFVar13->fadexpr_).left_;
  pFVar16 = (pFVar13->fadexpr_).right_;
  dVar4 = (pFVar15->fadexpr_).left_.constant_;
  dVar5 = ((pFVar15->fadexpr_).right_)->val_;
  dVar6 = (pFVar16->fadexpr_).left_.constant_;
  dVar7 = ((pFVar16->fadexpr_).right_)->val_;
  dVar8 = (pFVar14->fadexpr_).left_.constant_;
  dVar9 = ((pFVar14->fadexpr_).right_)->val_;
  dVar10 = (this_00->right_).constant_;
  vVar18 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
           ::fastAccessDx(this_00,i);
  pFVar11 = (this->left_->fadexpr_).left_;
  pFVar12 = (pFVar11->fadexpr_).left_;
  return vVar18 * ((((pFVar12->fadexpr_).left_)->val_ + ((pFVar12->fadexpr_).right_)->val_ +
                   ((pFVar11->fadexpr_).right_)->val_) - (this->left_->fadexpr_).right_.constant_) +
         ((dVar8 * dVar9 + dVar6 * dVar7 + dVar4 * dVar5) - dVar10) * (dVar1 + dVar2 + dVar3);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}